

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_storage.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::posix_storage::set_file_priority
          (posix_storage *this,vector<download_priority_t,_file_index_t> *prio,storage_error *ec)

{
  vector<download_priority_t,_file_index_t> *this_00;
  uchar uVar1;
  posix_part_file *ppVar2;
  undefined1 uVar3;
  bool bVar4;
  bool bVar5;
  int64_t size;
  file_index_t index;
  long lVar6;
  size_type __new_size;
  file_storage *local_98;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  int64_t local_60;
  string *local_58;
  string fp;
  
  __new_size = (long)(prio->
                     super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     ).
                     super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(prio->
                     super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     ).
                     super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->m_file_priority;
  if ((ulong)((long)(this->m_file_priority).
                    super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                    .
                    super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_file_priority).
                   super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   .
                   super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < __new_size) {
    ::std::
    vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
    ::resize(&this_00->
              super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
             ,__new_size,(value_type *)&default_priority);
  }
  local_98 = (this->m_mapped_files)._M_t.
             super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
             .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
  if (local_98 == (file_storage *)0x0) {
    local_98 = this->m_files;
  }
  local_58 = &this->m_save_path;
  lVar6 = 0;
  do {
    if (*(int *)&(prio->
                 super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 ).
                 super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
        *(int *)&(prio->
                 super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 ).
                 super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_start <= lVar6) {
      ppVar2 = (this->m_part_file)._M_t.
               super___uniq_ptr_impl<libtorrent::aux::posix_part_file,_std::default_delete<libtorrent::aux::posix_part_file>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::posix_part_file_*,_std::default_delete<libtorrent::aux::posix_part_file>_>
               .super__Head_base<0UL,_libtorrent::aux::posix_part_file_*,_false>._M_head_impl;
      if (ppVar2 != (posix_part_file *)0x0) {
        posix_part_file::flush_metadata(ppVar2,&ec->ec);
      }
      if ((ec->ec).val_ != 0) {
        *(undefined4 *)&ec->field_0x10 = 0x25fffffa;
      }
      return;
    }
    index.m_val = (int)lVar6;
    bVar4 = file_storage::pad_file_at(local_98,index);
    if (!bVar4) {
      uVar1 = (prio->
              super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              ).
              super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar6].m_val;
      uVar3 = (undefined1)((ulong)lVar6 >> 0x10);
      if ((this_00->
          super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ).
          super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar6].m_val == '\0') {
        if (((uVar1 != '\0') &&
            ((this->m_part_file)._M_t.
             super___uniq_ptr_impl<libtorrent::aux::posix_part_file,_std::default_delete<libtorrent::aux::posix_part_file>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::posix_part_file_*,_std::default_delete<libtorrent::aux::posix_part_file>_>
             .super__Head_base<0UL,_libtorrent::aux::posix_part_file_*,_false>._M_head_impl !=
             (posix_part_file *)0x0)) && (bVar4 = use_partfile(this,index), bVar4)) {
          ppVar2 = (this->m_part_file)._M_t.
                   super___uniq_ptr_impl<libtorrent::aux::posix_part_file,_std::default_delete<libtorrent::aux::posix_part_file>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_libtorrent::aux::posix_part_file_*,_std::default_delete<libtorrent::aux::posix_part_file>_>
                   .super__Head_base<0UL,_libtorrent::aux::posix_part_file_*,_false>._M_head_impl;
          local_78 = (code *)0x0;
          pcStack_70 = (code *)0x0;
          local_88._M_unused._M_object = (void *)0x0;
          local_88._8_8_ = 0;
          local_88._M_unused._M_object = operator_new(0x18);
          *(posix_storage **)local_88._M_unused._0_8_ = this;
          *(int *)((long)local_88._M_unused._0_8_ + 8) = index.m_val;
          *(storage_error **)((long)local_88._M_unused._0_8_ + 0x10) = ec;
          pcStack_70 = ::std::
                       _Function_handler<void_(long,_libtorrent::span<char>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/posix_storage.cpp:84:31)>
                       ::_M_invoke;
          local_78 = ::std::
                     _Function_handler<void_(long,_libtorrent::span<char>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/posix_storage.cpp:84:31)>
                     ::_M_manager;
          local_60 = file_storage::file_offset(local_98,index);
          size = file_storage::file_size(local_98,index);
          posix_part_file::export_file
                    (ppVar2,(function<void_(long,_libtorrent::span<char>)> *)&local_88,local_60,size
                     ,&ec->ec);
          ::std::_Function_base::~_Function_base((_Function_base *)&local_88);
          if ((ec->ec).val_ != 0) {
            *(short *)&ec->field_0x10 = (short)lVar6;
            ec->field_0x12 = uVar3;
            ec->operation = partfile_write;
            ::std::
            vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
            ::operator=(&prio->
                         super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                        ,&this_00->
                          super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                       );
            return;
          }
        }
      }
      else if (uVar1 == '\0') {
        file_storage::file_path(&fp,local_98,index,local_58);
        bVar5 = exists(&fp,&ec->ec);
        bVar4 = (ec->ec).failed_;
        if (bVar4 == true) {
          *(short *)&ec->field_0x10 = (short)lVar6;
          ec->field_0x12 = uVar3;
          ec->operation = file_stat;
          ::std::
          vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ::operator=(&prio->
                       super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                      ,&this_00->
                        super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     );
        }
        else {
          use_partfile(this,index,!bVar5);
        }
        ::std::__cxx11::string::~string((string *)&fp);
        if (bVar4 != false) {
          return;
        }
      }
      (ec->ec).val_ = 0;
      (ec->ec).failed_ = false;
      (ec->ec).cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      (this_00->
      super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      ).
      super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar6].m_val = uVar1;
      if (((this_00->
           super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
           ).
           super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar6].m_val == '\0') &&
         (bVar4 = use_partfile(this,index), bVar4)) {
        need_partfile(this);
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void posix_storage::set_file_priority(aux::vector<download_priority_t, file_index_t>& prio
		, storage_error& ec)
	{
		// extend our file priorities in case it's truncated
		// the default assumed priority is 4 (the default)
		if (prio.size() > m_file_priority.size())
			m_file_priority.resize(prio.size(), default_priority);

		file_storage const& fs = files();
		for (file_index_t i(0); i < prio.end_index(); ++i)
		{
			// pad files always have priority 0.
			if (fs.pad_file_at(i)) continue;

			download_priority_t const old_prio = m_file_priority[i];
			download_priority_t new_prio = prio[i];
			if (old_prio == dont_download && new_prio != dont_download)
			{
				if (m_part_file && use_partfile(i))
				{
					m_part_file->export_file([this, i, &ec](std::int64_t file_offset, span<char> buf)
					{
						// move stuff out of the part file
						file_pointer const f = open_file(i, open_mode::write, file_offset, ec);
						if (ec) return;
						int const r = static_cast<int>(std::fwrite(buf.data(), 1
							, static_cast<std::size_t>(buf.size()), f.file()));
						if (r != buf.size())
						{
							if (std::ferror(f.file())) ec.ec.assign(errno, generic_category());
							else ec.ec.assign(errors::file_too_short, libtorrent_category());
							return;
						}
					}, fs.file_offset(i), fs.file_size(i), ec.ec);

					if (ec)
					{
						ec.file(i);
						ec.operation = operation_t::partfile_write;
						prio = m_file_priority;
						return;
					}
				}
			}
			else if (old_prio != dont_download && new_prio == dont_download)
			{
				// move stuff into the part file
				// this is not implemented yet.
				// so we just don't use a partfile for this file

				std::string const fp = fs.file_path(i, m_save_path);
				bool const file_exists = exists(fp, ec.ec);
				if (ec.ec)
				{
					ec.file(i);
					ec.operation = operation_t::file_stat;
					prio = m_file_priority;
					return;
				}
				use_partfile(i, !file_exists);
			}
			ec.ec.clear();
			m_file_priority[i] = new_prio;

			if (m_file_priority[i] == dont_download && use_partfile(i))
			{
				need_partfile();
			}
		}
		if (m_part_file) m_part_file->flush_metadata(ec.ec);
		if (ec)
		{
			ec.file(torrent_status::error_file_partfile);
			ec.operation = operation_t::partfile_write;
		}
	}